

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O1

void __thiscall
Js::JavascriptBigInt::InitFromCharDigits<char16_t>
          (JavascriptBigInt *this,char16_t *pChar,uint32 charLength,bool isNegative)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  Recycler *this_00;
  unsigned_long *puVar5;
  undefined7 in_register_00000009;
  char16_t *pcVar6;
  digit_t digitAdd;
  ulong uVar7;
  undefined1 local_70 [8];
  TrackAllocData data;
  
  if (pChar == (char16_t *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                ,0x94,"(pChar != 0)","pChar != 0");
    if (!bVar2) goto LAB_00d32b37;
    *puVar4 = 0;
  }
  data._36_4_ = SUB84(CONCAT71(in_register_00000009,isNegative),0);
  this->m_length = 0;
  data.plusSize = this->m_maxLength;
  local_70 = (undefined1  [8])&unsigned_long::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_82f5f8c;
  data.filename._0_4_ = 0x99;
  this_00 = Memory::Recycler::TrackAllocInfo
                      (((((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                        super_JavascriptLibraryBase).scriptContext.ptr)->recycler,
                       (TrackAllocData *)local_70);
  uVar7 = this->m_maxLength;
  if (uVar7 == 0) {
    Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
    puVar5 = (unsigned_long *)&DAT_00000008;
  }
  else {
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00d32b37;
      *puVar4 = 0;
    }
    uVar7 = -(ulong)(uVar7 >> 0x3d != 0) | uVar7 << 3;
    if (uVar7 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fc,"(byteSize != 0 || !TAllocator::FakeZeroLengthArray)",
                                  "byteSize != 0 || !TAllocator::FakeZeroLengthArray");
      if (!bVar2) goto LAB_00d32b37;
      *puVar4 = 0;
    }
    puVar5 = (unsigned_long *)
             Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                       (this_00,uVar7);
    if (puVar5 == (unsigned_long *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) goto LAB_00d32b37;
      *puVar4 = 0;
    }
  }
  pcVar6 = pChar + ((ulong)charLength - 1);
  Memory::Recycler::WBSetBit((char *)&this->m_digits);
  (this->m_digits).ptr = puVar5;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->m_digits);
  this->m_isNegative = data._36_1_;
  uVar7 = 1;
  if (pChar < pcVar6) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    digitAdd = 0;
    do {
      bVar2 = NumberUtilities::IsDigit((uint)(ushort)*pChar);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                    ,0xa0,"(NumberUtilities::IsDigit(*pChar))",
                                    "NumberUtilities::IsDigit(*pChar)");
        if (!bVar2) goto LAB_00d32b37;
        *puVar4 = 0;
      }
      if (uVar7 == 1000000000) {
        MulThenAdd(this,1000000000,digitAdd);
        uVar7 = 1;
        digitAdd = 0;
      }
      uVar7 = uVar7 * 10;
      digitAdd = ((ulong)(ushort)*pChar + digitAdd * 10) - 0x30;
      pChar = pChar + 1;
    } while (pChar < pcVar6);
  }
  else {
    digitAdd = 0;
  }
  if (uVar7 < 2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                ,0xaa,"(1 < digitMul)","1 < digitMul");
    if (!bVar2) {
LAB_00d32b37:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  MulThenAdd(this,uVar7,digitAdd);
  if (this->m_length == 0) {
    this->m_isNegative = false;
    this->m_length = 1;
    *(this->m_digits).ptr = 0;
  }
  return;
}

Assistant:

void JavascriptBigInt::InitFromCharDigits(const EncodedChar *pChar, uint32 charLength, bool isNegative)
    {
        Assert(charLength >= 0);
        Assert(pChar != 0);

        const EncodedChar *pCharLimit = pChar + charLength - 1;//'n' at the end

        m_length = 0;
        m_digits = RecyclerNewArrayLeaf(this->GetScriptContext()->GetRecycler(), digit_t, m_maxLength);
        m_isNegative = isNegative;

        digit_t digitMul = 1;
        digit_t digitAdd = 0;
        for (; pChar < pCharLimit; pChar++)
        {
            Assert(NumberUtilities::IsDigit(*pChar));
            if (digitMul == 1e9)
            {
                MulThenAdd(digitMul, digitAdd);
                digitMul = 1;
                digitAdd = 0;
            }
            digitMul *= 10;
            digitAdd = digitAdd * 10 + *pChar - '0';
        }
        Assert(1 < digitMul);
        MulThenAdd(digitMul, digitAdd);

        // make sure this is no negative zero
        if (m_length == 0)
        {
            m_isNegative = false;
            m_length = 1;
            m_digits[0] = 0;
        }
    }